

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTest<ParticleArrayTest,_testing::internal::TemplateSel<ParticleArrayTest_Size_Test>,_testing::internal::Types1<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>_>
     ::Register(char *prefix,char *case_name,char *test_names,int index)

{
  TestFactoryBase *factory;
  char *pcVar1;
  String local_48;
  String local_38;
  String local_28;
  
  pcVar1 = "/";
  if (*prefix == '\0') {
    pcVar1 = "";
  }
  String::Format((char *)&local_28,"%s%s%s/%d",prefix,pcVar1,case_name,(ulong)(uint)index);
  GetPrefixUntilComma((internal *)&local_38,test_names);
  GetTypeName<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>>();
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_001f8fd0;
  MakeAndRegisterTestInfo
            (local_28.c_str_,local_38.c_str_,local_48.c_str_,(char *)0x0,
             &TypeIdHelper<ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>>>
              ::dummy_,Test::SetUpTestCase,Test::TearDownTestCase,factory);
  String::~String(&local_48);
  String::~String(&local_38);
  String::~String(&local_28);
  return true;
}

Assistant:

static bool Register(const char* prefix, const char* case_name,
                       const char* test_names, int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        String::Format("%s%s%s/%d", prefix, prefix[0] == '\0' ? "" : "/",
                       case_name, index).c_str(),
        GetPrefixUntilComma(test_names).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, case_name, test_names, index + 1);
  }